

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

err_t fileRead(size_t *read,void *buf,size_t count,file_t file)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  
  sVar3 = fread(buf,1,count,(FILE *)file);
  *read = sVar3;
  uVar2 = 0;
  if (sVar3 != count) {
    iVar1 = feof((FILE *)file);
    uVar2 = -(uint)(iVar1 != 0) | 0xcf;
  }
  return uVar2;
}

Assistant:

err_t fileRead(size_t* read, void* buf, size_t count, file_t file)
{
	ASSERT(memIsValid(buf, count));
	ASSERT(fileIsValid(file));
	ASSERT(memIsValid(read, O_PER_S));
	*read = fread(buf, 1, count, file);
	if (*read != count)
		return feof(file) ? ERR_MAX : ERR_FILE_READ;
	return ERR_OK;
}